

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O0

void __thiscall FlatIndexBuilder::add_trigram(FlatIndexBuilder *this,FileId fid,TriGram val)

{
  uint in_EDX;
  uint in_ESI;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(in_ESI,in_EDX),
             (value_type_conflict2 *)((ulong)in_ESI | (ulong)in_EDX << 0x28));
  return;
}

Assistant:

void FlatIndexBuilder::add_trigram(FileId fid, TriGram val) {
    raw_data.push_back(fid | (uint64_t{val} << 40ULL));
}